

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostei_deriv1_generator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int *piVar1;
  _Rb_tree_color _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  _Rb_tree_color *p_Var11;
  mapped_type *pmVar12;
  runtime_error *prVar13;
  uint uVar14;
  char *pcVar15;
  string *this;
  ulong uVar16;
  int local_d68;
  undefined1 local_d58 [12];
  int iStack_d4c;
  _Alloc_hider local_d48;
  size_type local_d40;
  char local_d38 [16];
  QuartetSet topquartets;
  _Base_ptr local_cf8;
  _Base_ptr local_cf0;
  undefined1 local_ce8 [16];
  size_t iarg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otheropt;
  string hpath;
  string fpath;
  key_type local_c74;
  OptionMap options;
  OSTEIDeriv1_Writer ostei_deriv1_writer;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> needed_am;
  char *local_be0;
  size_type local_bd8;
  char local_bd0 [8];
  undefined8 uStack_bc8;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_bc0;
  undefined1 local_b90 [48];
  OSTEI_VRR_Writer vrr_writer;
  OSTEI_HRR_Writer hrr_writer;
  undefined1 local_b20 [48];
  OSTEI_GeneratorInfo info;
  Makowski_HRR hrralgo;
  ofstream ofh;
  ofstream of;
  Makowski_VRR vrralgo;
  
  fpath._M_dataplus._M_p = (pointer)&fpath.field_2;
  fpath._M_string_length = 0;
  fpath.field_2._M_local_buf[0] = '\0';
  hpath._M_dataplus._M_p = (pointer)&hpath.field_2;
  hpath._M_string_length = 0;
  hpath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_be0,"",(allocator *)&hrralgo);
  local_d48._M_p = local_d38;
  local_d58._0_8_ = 0;
  local_d58._8_4_ = _S_red;
  iStack_d4c = 0;
  if (local_be0 == local_bd0) {
    local_d38[8] = (undefined1)uStack_bc8;
    local_d38[9] = uStack_bc8._1_1_;
    local_d38[10] = uStack_bc8._2_1_;
    local_d38[0xb] = uStack_bc8._3_1_;
    local_d38[0xc] = uStack_bc8._4_1_;
    local_d38[0xd] = uStack_bc8._5_1_;
    local_d38[0xe] = uStack_bc8._6_1_;
    local_d38[0xf] = uStack_bc8._7_1_;
  }
  else {
    local_d48._M_p = local_be0;
  }
  local_d40 = local_bd8;
  local_bd8 = 0;
  local_bd0[0] = '\0';
  local_be0 = local_bd0;
  std::__cxx11::string::~string((string *)&local_be0);
  DefaultOptions();
  ParseCommonOptions_abi_cxx11_(&otheropt,&options,argc,argv);
  iarg = 0;
  bVar8 = false;
  local_d68 = 0;
  while (iarg < (ulong)((long)otheropt.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)otheropt.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    GetNextArg((string *)&hrralgo,&iarg,&otheropt);
    bVar6 = std::operator==((string *)&hrralgo,"-o");
    if (bVar6) {
      GetNextArg((string *)&vrralgo,&iarg,&otheropt);
      this = &fpath;
LAB_00106179:
      std::__cxx11::string::operator=((string *)this,(string *)&vrralgo);
      std::__cxx11::string::~string((string *)&vrralgo);
      bVar6 = true;
    }
    else {
      bVar6 = std::operator==((string *)&hrralgo,"-oh");
      if (bVar6) {
        GetNextArg((string *)&vrralgo,&iarg,&otheropt);
        this = &hpath;
        goto LAB_00106179;
      }
      bVar6 = std::operator==((string *)&hrralgo,"-q");
      if (bVar6) {
        iVar9 = GetIArg(&iarg,&otheropt);
        local_d58._0_4_ = iVar9;
        iVar9 = GetIArg(&iarg,&otheropt);
        local_d58._4_4_ = iVar9;
        iVar9 = GetIArg(&iarg,&otheropt);
        local_d58._8_4_ = iVar9;
        iVar9 = GetIArg(&iarg,&otheropt);
        iStack_d4c = iVar9;
        bVar6 = true;
        bVar8 = true;
      }
      else {
        std::operator<<((ostream *)&std::cout,"\n\n");
        std::operator<<((ostream *)&std::cout,"--------------------------------\n");
        poVar10 = std::operator<<((ostream *)&std::cout,"Unknown argument: ");
        poVar10 = std::operator<<(poVar10,(string *)&hrralgo);
        std::operator<<(poVar10,"\n");
        std::operator<<((ostream *)&std::cout,"--------------------------------\n");
        bVar6 = false;
        local_d68 = 1;
      }
    }
    std::__cxx11::string::~string((string *)&hrralgo);
    if (!bVar6) goto LAB_001065ea;
  }
  bVar6 = std::operator!=(&fpath,"");
  if (bVar6) {
    bVar6 = std::operator!=(&hpath,"");
    if (bVar6) {
      if (bVar8) {
        poVar10 = std::operator<<((ostream *)&std::cout,"Generating source file ");
        poVar10 = std::operator<<(poVar10,(string *)&fpath);
        std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<((ostream *)&std::cout,"Appending to header file ");
        poVar10 = std::operator<<(poVar10,(string *)&hpath);
        std::operator<<(poVar10,"\n");
        std::ofstream::ofstream(&of,(string *)&fpath,_S_out);
        cVar7 = std::__basic_file<char>::is_open();
        if (cVar7 == '\0') {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          StringBuilder<char[19],std::__cxx11::string&,char_const(&)[2]>
                    ((string *)&hrralgo,(char (*) [19])"Cannot open file: ",&fpath,
                     (char (*) [2])0x13c864);
          std::runtime_error::runtime_error(prVar13,(string *)&hrralgo);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::ofstream::ofstream(&ofh,(string *)&hpath,_S_app);
        cVar7 = std::__basic_file<char>::is_open();
        if (cVar7 == '\0') {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          StringBuilder<char[19],std::__cxx11::string&,char_const(&)[2]>
                    ((string *)&hrralgo,(char (*) [19])"Cannot open file: ",&hpath,
                     (char (*) [2])0x13c864);
          std::runtime_error::runtime_error(prVar13,(string *)&hrralgo);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        QAM::QAM((QAM *)local_b90,(QAM *)local_d58);
        OSTEI_GeneratorInfo::GeneratorInfoBase(&info,(QAM *)local_b90,1,&options);
        std::__cxx11::string::~string((string *)(local_b90 + 0x10));
        Makowski_HRR::Makowski_HRR(&hrralgo,&info);
        Makowski_VRR::Makowski_VRR(&vrralgo,&info);
        needed_am._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &needed_am._M_t._M_impl.super__Rb_tree_header._M_header;
        needed_am._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        needed_am._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        needed_am._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        needed_am._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             needed_am._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var11 = (_Rb_tree_color *)
                  std::__max_element<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_d58,&local_d48);
        _Var2 = *p_Var11;
        uVar14 = 0;
        if (local_d58._0_4_ != _Var2) {
          uVar14 = 1;
          if (local_d58._4_4_ != _Var2) {
            uVar14 = local_d58._8_4_ == _Var2 ^ 3;
          }
        }
        for (uVar16 = 0; uVar4 = stack0xfffffffffffff2b0, uVar3 = local_d58._0_8_, uVar16 != 0x10;
            uVar16 = uVar16 + 4) {
          if (uVar14 * 4 != uVar16) {
            std::__cxx11::string::string
                      ((string *)&local_cf8,
                       (char *)((long)&DAT_0012f138 + (long)*(int *)((long)&DAT_0012f138 + uVar16)),
                       (allocator *)&ostei_deriv1_writer);
            uVar5 = stack0xfffffffffffff2b0;
            topquartets._M_t._M_impl._0_8_ = uVar3;
            local_d58._8_4_ = (undefined4)uVar4;
            iStack_d4c = SUB84(uVar4,4);
            topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_d58._8_4_;
            topquartets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = iStack_d4c;
            topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            if (local_cf8 == (_Base_ptr)local_ce8) {
              topquartets._M_t._M_impl.super__Rb_tree_header._M_node_count = local_ce8._8_8_;
            }
            else {
              topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_cf8;
            }
            topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)CONCAT71(local_ce8._1_7_,local_ce8[0]);
            topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_cf0;
            local_cf0 = (_Base_ptr)0x0;
            local_ce8[0] = _S_red;
            unique0x10000f16 = uVar5;
            local_cf8 = (_Base_ptr)local_ce8;
            std::__cxx11::string::~string((string *)&local_cf8);
            QAM::QAM((QAM *)&ostei_deriv1_writer,(QAM *)local_d58);
            piVar1 = (int *)(&topquartets._M_t._M_impl.field_0x0 + uVar16);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)&ostei_deriv1_writer.super_OSTEI_Writer_Base.
                                    _vptr_OSTEI_Writer_Base + uVar16);
            *piVar1 = *piVar1 + -1;
            std::_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>>::
            _M_insert_unique<QAM_const&>
                      ((_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>> *)
                       &needed_am,(QAM *)&topquartets);
            QAM::QAM((QAM *)local_b20,(QAM *)&ostei_deriv1_writer);
            bVar8 = ValidQAM((QAM *)local_b20);
            std::__cxx11::string::~string((string *)(local_b20 + 0x10));
            if (bVar8) {
              std::_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>>::
              _M_insert_unique<QAM_const&>
                        ((_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>> *
                         )&needed_am,(QAM *)&ostei_deriv1_writer);
            }
            std::__cxx11::string::~string
                      ((string *)&ostei_deriv1_writer.super_OSTEI_Writer_Base.osh_);
            std::__cxx11::string::~string
                      ((string *)&topquartets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      );
          }
        }
        info.deriv1_missing_center_ = uVar14;
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::_Rb_tree
                  (&local_bc0,&needed_am._M_t);
        OSTEI_HRR_Algorithm_Base::Create
                  (&hrralgo.super_OSTEI_HRR_Algorithm_Base,
                   (set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_bc0);
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&local_bc0);
        topquartets._M_t._M_impl._0_4_ = 2;
        pmVar12 = std::
                  map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                  ::operator[](&options,(key_type *)&topquartets);
        iVar9 = *pmVar12;
        ostei_deriv1_writer.super_OSTEI_Writer_Base._vptr_OSTEI_Writer_Base._0_4_ = 3;
        pmVar12 = std::
                  map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                  ::operator[](&options,(key_type *)&ostei_deriv1_writer);
        OSTEI_HRR_Writer::OSTEI_HRR_Writer
                  (&hrr_writer,&hrralgo.super_OSTEI_HRR_Algorithm_Base,&info,iVar9,*pmVar12);
        OSTEI_HRR_Algorithm_Base::TopQuartets(&topquartets,&hrralgo.super_OSTEI_HRR_Algorithm_Base);
        OSTEI_VRR_Algorithm_Base::Create(&vrralgo.super_OSTEI_VRR_Algorithm_Base,&topquartets);
        ostei_deriv1_writer.super_OSTEI_Writer_Base._vptr_OSTEI_Writer_Base._0_4_ = 0;
        pmVar12 = std::
                  map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                  ::operator[](&options,(key_type *)&ostei_deriv1_writer);
        iVar9 = *pmVar12;
        local_c74 = GeneralVRR;
        pmVar12 = std::
                  map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                  ::operator[](&options,&local_c74);
        OSTEI_VRR_Writer::OSTEI_VRR_Writer
                  (&vrr_writer,&vrralgo.super_OSTEI_VRR_Algorithm_Base,&info,iVar9,*pmVar12);
        OSTEIDeriv1_Writer::OSTEI_Writer_Base
                  (&ostei_deriv1_writer,(ostream *)&of,(ostream *)&ofh,&info,&vrr_writer,&hrr_writer
                  );
        OSTEIDeriv1_Writer::WriteFile(&ostei_deriv1_writer);
        std::
        _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
        ::~_Rb_tree(&topquartets._M_t);
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&needed_am._M_t);
        OSTEI_VRR_Algorithm_Base::~OSTEI_VRR_Algorithm_Base(&vrralgo.super_OSTEI_VRR_Algorithm_Base)
        ;
        OSTEI_HRR_Algorithm_Base::~OSTEI_HRR_Algorithm_Base(&hrralgo.super_OSTEI_HRR_Algorithm_Base)
        ;
        OSTEI_GeneratorInfo::~OSTEI_GeneratorInfo(&info);
        std::ofstream::~ofstream(&ofh);
        std::ofstream::~ofstream(&of);
        local_d68 = 0;
LAB_001065ea:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&otheropt);
        std::
        _Rb_tree<Option,_std::pair<const_Option,_int>,_std::_Select1st<std::pair<const_Option,_int>_>,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
        ::~_Rb_tree(&options._M_t);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&hpath);
        std::__cxx11::string::~string((string *)&fpath);
        return local_d68;
      }
      poVar10 = std::operator<<((ostream *)&std::cout,"\n");
      pcVar15 = "AM quartet (-q) required";
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cout,"\n");
      pcVar15 = "output header file path (-oh) required";
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,"\n");
    pcVar15 = "output source file path (-o) required";
  }
  poVar10 = std::operator<<(poVar10,pcVar15);
  std::operator<<(poVar10,"\n\n");
  local_d68 = 1;
  goto LAB_001065ea;
}

Assistant:

int main(int argc, char ** argv)
{
    try {


    // other stuff
    std::string fpath;
    std::string hpath;
    QAM finalam{0,0,0,0};

    bool finalamset = false;

    // parse command line
    OptionMap options = DefaultOptions();
    std::vector<std::string> otheropt = ParseCommonOptions(options, argc, argv);

    // parse specific options
    size_t iarg = 0;
    while(iarg < otheropt.size())
    {
        std::string argstr(GetNextArg(iarg, otheropt));
        if(argstr == "-o")
            fpath = GetNextArg(iarg, otheropt);
        else if(argstr == "-oh")
            hpath = GetNextArg(iarg, otheropt);
        else if(argstr == "-q")
        {
            finalam[0] = GetIArg(iarg, otheropt);   
            finalam[1] = GetIArg(iarg, otheropt);   
            finalam[2] = GetIArg(iarg, otheropt);   
            finalam[3] = GetIArg(iarg, otheropt);   
            finalamset = true;
        }
        else
        {
            std::cout << "\n\n";
            std::cout << "--------------------------------\n";
            std::cout << "Unknown argument: " << argstr << "\n";
            std::cout << "--------------------------------\n";
            return 1; 
        } 
    }


    // check for required options
    CMDLINE_ASSERT( fpath != "", "output source file path (-o) required" )
    CMDLINE_ASSERT( hpath != "", "output header file path (-oh) required" )
    CMDLINE_ASSERT( finalamset == true, "AM quartet (-q) required" )


    // open the output file
    // actually create
    std::cout << "Generating source file " << fpath << "\n";
    std::cout << "Appending to header file " << hpath << "\n";

    std::ofstream of(fpath);
    if(!of.is_open())
        throw std::runtime_error(StringBuilder("Cannot open file: ", fpath, "\n"));

    std::ofstream ofh(hpath, std::ofstream::app);
    if(!ofh.is_open())
        throw std::runtime_error(StringBuilder("Cannot open file: ", hpath, "\n"));
    

    // Information for this OSTEI
    OSTEI_GeneratorInfo info(finalam, 1, options);


    //////////////////////////////////////////////////////////////
    //! \todo Are there special permutations for derivatives?
    //////////////////////////////////////////////////////////////

    // algorithms used
    Makowski_HRR hrralgo(info);
    Makowski_VRR vrralgo(info);

    // Working backwards, I need:
    // 1.) HRR Steps
    //     We need the different increments, decrements for derivatives
    std::set<QAM> needed_am;

    // We only need to do three centers. The fourth is free
    // Find which one to skip
    int max = *(std::max_element(finalam.begin(), finalam.end()));
    
    int missing_center;
    if(finalam[0] == max)
        missing_center = 0;
    else if(finalam[1] == max)
        missing_center = 1;
    else if(finalam[2] == max)
        missing_center = 2;
    else
        missing_center = 3;
    
    const char * dir[4] = {"2a", "2b", "2c", "2d"};
    for(int i = 0; i < 4; i++)
    {
        if(i == missing_center)
            continue;

        QAM amtmp_p(finalam.qam, dir[i]);
        QAM amtmp_m(finalam);
        amtmp_p.qam[i]++;
        amtmp_m.qam[i]--;

        needed_am.insert(amtmp_p);
        if(ValidQAM(amtmp_m))
            needed_am.insert(amtmp_m);
    }

    info.SetDeriv1_MissingCenter(missing_center);

    hrralgo.Create(needed_am);
    OSTEI_HRR_Writer hrr_writer(hrralgo, info,
                                options[Option::ExternalHRR],
                                options[Option::GeneralHRR]);

    QuartetSet topquartets = hrralgo.TopQuartets();

    // 2.) VRR Steps
    vrralgo.Create(topquartets);
    OSTEI_VRR_Writer vrr_writer(vrralgo, info,
                                options[Option::ExternalVRR],
                                options[Option::GeneralVRR]);


    // Create the OSTEI_Writer and write the file
    OSTEIDeriv1_Writer ostei_deriv1_writer(of, ofh, info, vrr_writer, hrr_writer);
    ostei_deriv1_writer.WriteFile();



    }
    catch(std::exception & ex)
    {
        std::cout << "\n\n";
        std::cout << "Caught exception\n";
        std::cout << "What = " << ex.what() << "\n\n";
        return 1;
    }
    return 0;
}